

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

void xmlCatalogFreeLocal(void *catalogs)

{
  long *plVar1;
  xmlChar *in_RSI;
  
  if (xmlCatalogInitialized == '\0') {
    xmlInitializeCatalog();
  }
  if (catalogs != (void *)0x0) {
    do {
      plVar1 = *catalogs;
      xmlFreeCatalogEntry(catalogs,in_RSI);
      catalogs = plVar1;
    } while (plVar1 != (long *)0x0);
  }
  return;
}

Assistant:

void
xmlCatalogFreeLocal(void *catalogs) {
    xmlCatalogEntryPtr catal;

    if (!xmlCatalogInitialized)
	xmlInitializeCatalog();

    catal = (xmlCatalogEntryPtr) catalogs;
    if (catal != NULL)
	xmlFreeCatalogEntryList(catal);
}